

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::MetaData::getValue(MetaData *this,int index,char **value)

{
  size_type sVar1;
  Entry *pEVar2;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_stack_00000014;
  Entry *e;
  
  if ((in_ESI < 0) ||
     (sVar1 = std::
              vector<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
              ::size((vector<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
                      *)(in_RDI + 0x40)), (int)sVar1 <= in_ESI)) {
    *in_RDX = 0;
    return;
  }
  pEVar2 = getEntry((MetaData *)e,in_stack_00000014);
  if ((pEVar2 != (Entry *)0x0) && (pEVar2->type == mdt_string)) {
    *in_RDX = pEVar2->data;
    return;
  }
  *in_RDX = 0;
  return;
}

Assistant:

virtual void getValue(int index, const char*& value)
	{
	    if (index < 0 || index >= int(_entries.size())) { value = 0; return; }
	    Entry* e = getEntry(index);
	    if (e && e->type == mdt_string) value = (const char*) e->data;
	    else value = 0;
	}